

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O3

void __thiscall wasm::FunctionValidator::visitLocalSet(FunctionValidator *this,LocalSet *curr)

{
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  Type TVar4;
  Type right;
  
  uVar1 = curr->index;
  sVar3 = Function::getNumLocals
                    ((this->
                     super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                     ).
                     super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .
                     super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .currFunction);
  bVar2 = ValidationInfo::shouldBeTrue<wasm::LocalSet*>
                    (this->info,uVar1 < sVar3,curr,"local.set index must be small enough",
                     (this->
                     super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                     ).
                     super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .
                     super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .currFunction);
  if ((bVar2) && (TVar4.id = (curr->value->type).id, TVar4.id != 1)) {
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id != 0) {
      TVar4 = Function::getLocalType
                        ((this->
                         super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                         ).
                         super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                         .
                         super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                         .currFunction,curr->index);
      ValidationInfo::shouldBeEqual<wasm::LocalSet*,wasm::Type>
                (this->info,TVar4,
                 (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.
                       type.id,curr,"local.set type must be correct",
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                 ).
                 super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .
                 super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .currFunction);
      TVar4.id = (curr->value->type).id;
    }
    right = Function::getLocalType
                      ((this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .currFunction,curr->index);
    shouldBeSubType(this,TVar4,right,(Expression *)curr,"local.set\'s value type must be correct");
    return;
  }
  return;
}

Assistant:

void FunctionValidator::visitLocalSet(LocalSet* curr) {
  if (shouldBeTrue(curr->index < getFunction()->getNumLocals(),
                   curr,
                   "local.set index must be small enough")) {
    if (curr->value->type != Type::unreachable) {
      if (curr->type != Type::none) { // tee is ok anyhow
        shouldBeEqual(getFunction()->getLocalType(curr->index),
                      curr->type,
                      curr,
                      "local.set type must be correct");
      }
      shouldBeSubType(curr->value->type,
                      getFunction()->getLocalType(curr->index),
                      curr,
                      "local.set's value type must be correct");
    }
  }
}